

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O0

int __thiscall ncnn::Reshape::load_param(Reshape *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  
  iVar1 = ParamDict::get(in_RSI,0,-0xe9);
  *(int *)(in_RDI + 0xd0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,-0xe9);
  *(int *)(in_RDI + 0xd4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xb,-0xe9);
  *(int *)(in_RDI + 0xd8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,-0xe9);
  *(int *)(in_RDI + 0xdc) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,0);
  *(int *)(in_RDI + 0xe0) = iVar1;
  *(undefined4 *)(in_RDI + 0xe4) = 4;
  if (*(int *)(in_RDI + 0xd8) == -0xe9) {
    *(undefined4 *)(in_RDI + 0xe4) = 3;
  }
  if (*(int *)(in_RDI + 0xdc) == -0xe9) {
    *(undefined4 *)(in_RDI + 0xe4) = 2;
  }
  if (*(int *)(in_RDI + 0xd4) == -0xe9) {
    *(undefined4 *)(in_RDI + 0xe4) = 1;
  }
  if (*(int *)(in_RDI + 0xd0) == -0xe9) {
    *(undefined4 *)(in_RDI + 0xe4) = 0;
  }
  return 0;
}

Assistant:

int Reshape::load_param(const ParamDict& pd)
{
    w = pd.get(0, -233);
    h = pd.get(1, -233);
    d = pd.get(11, -233);
    c = pd.get(2, -233);
    permute = pd.get(3, 0);

    ndim = 4;
    if (d == -233)
        ndim = 3;
    if (c == -233)
        ndim = 2;
    if (h == -233)
        ndim = 1;
    if (w == -233)
        ndim = 0;

    return 0;
}